

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v8::detail::
for_each_codepoint<fmt::v8::detail::compute_width(fmt::v8::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  bool bVar1;
  uint uVar2;
  type size;
  size_t __n;
  detail *pdVar3;
  size_t sVar4;
  detail *pdVar5;
  char *pcVar6;
  char *pcVar7;
  detail *__src;
  byte *pbVar8;
  string_view sVar9;
  string_view sVar10;
  anon_class_8_1_54a39806 decode;
  char buf [7];
  count_code_points local_48;
  char *local_40;
  byte local_38 [8];
  
  local_48.count = (size_t *)s.size_;
  pcVar6 = s.data_;
  pcVar7 = pcVar6;
  __src = this;
  if ((char *)0x3 < pcVar6) {
    pdVar5 = this;
    local_40 = pcVar6;
    do {
      pdVar3 = pdVar5;
      __src = pdVar3;
      if (this + (long)pcVar6 + -3 <= pdVar3) break;
      sVar4 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                    [(byte)*pdVar3 >> 3] +
              (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                            [(byte)*pdVar3 >> 3] == 0);
      uVar2 = ((byte)pdVar3[3] & 0x3f |
              ((byte)pdVar3[2] & 0x3f) << 6 |
              ((byte)pdVar3[1] & 0x3f) << 0xc |
              ((int)(char)*pdVar3 & *(uint *)(&DAT_001406d0 + sVar4 * 4)) << 0x12) >>
              ((&DAT_00140710)[sVar4 * 4] & 0x1f);
      sVar9.size_ = sVar4;
      sVar9.data_ = (char *)pdVar3;
      bVar1 = anon_func::count_code_points::operator()
                        (&local_48,
                         -(uint)(((((byte)pdVar3[1] >> 2 & 0xfffffff0) +
                                   (uint)((byte)pdVar3[2] >> 6) * 4 | (uint)((byte)pdVar3[3] >> 6) |
                                   (uint)(uVar2 < *(uint *)(&DAT_001406f0 + sVar4 * 4)) << 6 |
                                   (uint)(0x10ffff < uVar2) << 8 |
                                  (uint)((uVar2 & 0xfffff800) == 0xd800) << 7) ^ 0x2a) >>
                                 ((&DAT_00140730)[sVar4 * 4] & 0x1f) != 0) | uVar2,sVar9);
      if (bVar1) {
        pdVar5 = pdVar3 + sVar4;
      }
      else {
        pdVar5 = (detail *)0x0;
      }
      __src = (detail *)0x0;
    } while (pdVar5 != (detail *)0x0);
    pcVar7 = local_40;
    if (pdVar3 < this + (long)pcVar6 + -3) {
      return;
    }
  }
  __n = (long)(this + (long)pcVar7) - (long)__src;
  if (__n != 0) {
    local_38[4] = 0;
    local_38[5] = 0;
    local_38[6] = 0;
    local_38[0] = 0;
    local_38[1] = 0;
    local_38[2] = 0;
    local_38[3] = 0;
    memcpy(local_38,__src,__n);
    pbVar8 = local_38;
    do {
      sVar4 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[*pbVar8 >> 3]
              + (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                              [*pbVar8 >> 3] == 0);
      uVar2 = (pbVar8[3] & 0x3f |
              (pbVar8[2] & 0x3f) << 6 |
              (pbVar8[1] & 0x3f) << 0xc |
              ((int)(char)*pbVar8 & *(uint *)(&DAT_001406d0 + sVar4 * 4)) << 0x12) >>
              ((&DAT_00140710)[sVar4 * 4] & 0x1f);
      sVar10.size_ = sVar4;
      sVar10.data_ = (char *)__src;
      bVar1 = anon_func::count_code_points::operator()
                        (&local_48,
                         -(uint)((((pbVar8[1] >> 2 & 0xfffffff0) + (uint)(pbVar8[2] >> 6) * 4 |
                                   (uint)(pbVar8[3] >> 6) |
                                   (uint)(uVar2 < *(uint *)(&DAT_001406f0 + sVar4 * 4)) << 6 |
                                   (uint)(0x10ffff < uVar2) << 8 |
                                  (uint)((uVar2 & 0xfffff800) == 0xd800) << 7) ^ 0x2a) >>
                                 ((&DAT_00140730)[sVar4 * 4] & 0x1f) != 0) | uVar2,sVar10);
      if (!bVar1) {
        return;
      }
      pbVar8 = pbVar8 + sVar4;
      __src = __src + sVar4;
    } while ((long)pbVar8 - (long)local_38 < (long)__n);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, to_unsigned(end - buf_ptr)));
    return result ? end : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}